

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandleUuidCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCommand *pcVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  bool bVar9;
  pointer pbVar10;
  uint uVar11;
  string e_1;
  string uuid;
  string uuidNamespaceString;
  string uuidType;
  cmUuid uuidGenerator;
  string uuidName;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uuidNamespace;
  string local_130;
  string local_110;
  cmCommand *local_f0;
  string local_e8;
  pointer local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  cmUuid local_a0;
  string local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  if (uVar5 < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"UUID sub-command requires an output variable.","");
    cmCommand::SetError(&this->super_cmCommand,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  bVar9 = false;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_f0 = &this->super_cmCommand;
  local_c8 = pbVar10;
  if (0x40 < uVar5) {
    uVar11 = 2;
    uVar5 = 2;
    bVar9 = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar10 + uVar5));
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar5));
        if (iVar4 == 0) {
          if ((ulong)(uVar11 + 1) <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_88);
            goto LAB_00288327;
          }
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"UUID sub-command, NAME requires a value.","");
          cmCommand::SetError(local_f0,&local_110);
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar5));
          if (iVar4 == 0) {
            if ((ulong)(uVar11 + 1) <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&local_c0);
              goto LAB_00288327;
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"UUID sub-command, TYPE requires a value.","");
            cmCommand::SetError(local_f0,&local_110);
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar5));
            if (iVar4 == 0) {
              uVar11 = uVar11 + 1;
              bVar9 = true;
              goto LAB_0028832b;
            }
            std::operator+(&local_130,"UUID sub-command does not recognize option ",
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar5);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
            pcVar2 = local_f0;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            puVar8 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_110.field_2._M_allocated_capacity = *puVar8;
              local_110.field_2._8_8_ = plVar6[3];
            }
            else {
              local_110.field_2._M_allocated_capacity = *puVar8;
              local_110._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_110._M_string_length = plVar6[1];
            *plVar6 = (long)puVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            cmCommand::SetError(pcVar2,&local_110);
          }
        }
LAB_0028876b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        bVar9 = false;
        goto LAB_00288789;
      }
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(uVar11 + 1)) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"UUID sub-command, NAMESPACE requires a value.","");
        cmCommand::SetError(local_f0,&local_110);
        goto LAB_0028876b;
      }
      std::__cxx11::string::_M_assign((string *)&local_e8);
LAB_00288327:
      uVar11 = uVar11 + 2;
LAB_0028832b:
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (ulong)uVar11;
    } while (uVar5 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5)
            );
  }
  local_110._M_string_length = 0;
  local_110.field_2._M_allocated_capacity =
       local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  cmUuid::cmUuid(&local_a0);
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = cmUuid::StringToBinary(&local_a0,&local_e8,&local_68);
  pcVar2 = local_f0;
  if (bVar3) {
    iVar4 = std::__cxx11::string::compare((char *)&local_c0);
    if (iVar4 == 0) {
      cmUuid::FromMd5(&local_130,&local_a0,&local_68,&local_88);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar4 != 0) {
        std::operator+(&local_50,"UUID sub-command, unknown TYPE \'",&local_c0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_130.field_2._M_allocated_capacity = *psVar7;
          local_130.field_2._8_8_ = plVar6[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar7;
          local_130._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_130._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(pcVar2,&local_130);
        goto LAB_0028867a;
      }
      cmUuid::FromSha1(&local_130,&local_a0,&local_68,&local_88);
    }
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_110._M_string_length != 0) {
      if (bVar9) {
        cmsys::SystemTools::UpperCase(&local_130,&local_110);
        std::__cxx11::string::operator=((string *)&local_110,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
      }
      bVar9 = true;
      cmMakefile::AddDefinition(pcVar2->Makefile,local_c8 + 1,local_110._M_dataplus._M_p);
      goto LAB_00288693;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"UUID sub-command, generation failed.","");
    cmCommand::SetError(pcVar2,&local_130);
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"UUID sub-command, malformed NAMESPACE UUID.","");
    cmCommand::SetError(pcVar2,&local_130);
  }
LAB_0028867a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  bVar9 = false;
LAB_00288693:
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
LAB_00288789:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

bool cmStringCommand
::HandleUuidCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  unsigned int argsIndex = 1;

  if(args.size() < 2)
    {
    this->SetError("UUID sub-command requires an output variable.");
    return false;
    }

  const std::string &outputVariable = args[argsIndex++];

  std::string uuidNamespaceString;
  std::string uuidName;
  std::string uuidType;
  bool uuidUpperCase = false;

  while(args.size() > argsIndex)
    {
    if(args[argsIndex] == "NAMESPACE")
      {
      ++argsIndex;
      if(argsIndex >= args.size())
        {
        this->SetError("UUID sub-command, NAMESPACE requires a value.");
        return false;
        }
      uuidNamespaceString = args[argsIndex++];
      }
    else if(args[argsIndex] == "NAME")
      {
      ++argsIndex;
      if(argsIndex >= args.size())
        {
        this->SetError("UUID sub-command, NAME requires a value.");
        return false;
        }
      uuidName = args[argsIndex++];
      }
    else if(args[argsIndex] == "TYPE")
      {
      ++argsIndex;
      if(argsIndex >= args.size())
        {
        this->SetError("UUID sub-command, TYPE requires a value.");
        return false;
        }
      uuidType = args[argsIndex++];
      }
    else if(args[argsIndex] == "UPPER")
      {
      ++argsIndex;
      uuidUpperCase = true;
      }
    else
      {
      std::string e = "UUID sub-command does not recognize option " +
          args[argsIndex] + ".";
      this->SetError(e);
      return false;
      }
    }

  std::string uuid;
  cmUuid uuidGenerator;

  std::vector<unsigned char> uuidNamespace;
  if(!uuidGenerator.StringToBinary(uuidNamespaceString, uuidNamespace))
    {
    this->SetError("UUID sub-command, malformed NAMESPACE UUID.");
    return false;
    }

  if(uuidType == "MD5")
    {
    uuid = uuidGenerator.FromMd5(uuidNamespace, uuidName);
    }
  else if(uuidType == "SHA1")
    {
    uuid = uuidGenerator.FromSha1(uuidNamespace, uuidName);
    }
  else
    {
    std::string e = "UUID sub-command, unknown TYPE '" + uuidType + "'.";
    this->SetError(e);
    return false;
    }

  if(uuid.empty())
    {
    this->SetError("UUID sub-command, generation failed.");
    return false;
    }

  if(uuidUpperCase)
    {
    uuid = cmSystemTools::UpperCase(uuid);
    }

  this->Makefile->AddDefinition(outputVariable, uuid.c_str());
  return true;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}